

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase * __thiscall Catch::TestCase::operator=(TestCase *this,TestCase *other)

{
  TestCase temp;
  TestCase TStack_128;
  
  TestCase(&TStack_128,other);
  swap(this,&TStack_128);
  if (TStack_128.test.m_p != (ITestCase *)0x0) {
    (*((TStack_128.test.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  TestCaseInfo::~TestCaseInfo(&TStack_128.super_TestCaseInfo);
  return this;
}

Assistant:

TestCase& TestCase::operator = ( TestCase const& other ) {
        TestCase temp( other );
        swap( temp );
        return *this;
    }